

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall
tinyxml2::XMLText::ParseDeep(XMLText *this,char *p,StrPair *param_2,int *curLineNumPtr)

{
  bool bVar1;
  Whitespace WVar2;
  char *pcVar3;
  uint local_34;
  int flags;
  int *curLineNumPtr_local;
  StrPair *param_2_local;
  char *p_local;
  XMLText *this_local;
  
  bVar1 = CData(this);
  if (bVar1) {
    this_local = (XMLText *)
                 StrPair::ParseText(&(this->super_XMLNode)._value,p,"]]>",2,curLineNumPtr);
    if (this_local == (XMLText *)0x0) {
      XMLDocument::SetError
                ((this->super_XMLNode)._document,XML_ERROR_PARSING_CDATA,
                 (this->super_XMLNode)._parseLineNum,(char *)0x0);
    }
  }
  else {
    bVar1 = XMLDocument::ProcessEntities((this->super_XMLNode)._document);
    local_34 = 2;
    if (bVar1) {
      local_34 = 3;
    }
    WVar2 = XMLDocument::WhitespaceMode((this->super_XMLNode)._document);
    if (WVar2 == COLLAPSE_WHITESPACE) {
      local_34 = local_34 | 4;
    }
    pcVar3 = StrPair::ParseText(&(this->super_XMLNode)._value,p,"<",local_34,curLineNumPtr);
    if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
      if (pcVar3 == (char *)0x0) {
        XMLDocument::SetError
                  ((this->super_XMLNode)._document,XML_ERROR_PARSING_TEXT,
                   (this->super_XMLNode)._parseLineNum,(char *)0x0);
      }
      this_local = (XMLText *)0x0;
    }
    else {
      this_local = (XMLText *)(pcVar3 + -1);
    }
  }
  return (char *)this_local;
}

Assistant:

char* XMLText::ParseDeep( char* p, StrPair*, int* curLineNumPtr )
{
    if ( this->CData() ) {
        p = _value.ParseText( p, "]]>", StrPair::NEEDS_NEWLINE_NORMALIZATION, curLineNumPtr );
        if ( !p ) {
            _document->SetError( XML_ERROR_PARSING_CDATA, _parseLineNum, 0 );
        }
        return p;
    }
    else {
        int flags = _document->ProcessEntities() ? StrPair::TEXT_ELEMENT : StrPair::TEXT_ELEMENT_LEAVE_ENTITIES;
        if ( _document->WhitespaceMode() == COLLAPSE_WHITESPACE ) {
            flags |= StrPair::NEEDS_WHITESPACE_COLLAPSING;
        }

        p = _value.ParseText( p, "<", flags, curLineNumPtr );
        if ( p && *p ) {
            return p-1;
        }
        if ( !p ) {
            _document->SetError( XML_ERROR_PARSING_TEXT, _parseLineNum, 0 );
        }
    }
    return 0;
}